

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O0

void __thiscall
Rml::ScrollController::ActivateSmoothscroll
          (ScrollController *this,Element *in_target,Vector2f delta_distance,
          ScrollBehavior scroll_behavior)

{
  bool bVar1;
  ScrollBehavior scroll_behavior_local;
  Element *in_target_local;
  ScrollController *this_local;
  Vector2f delta_distance_local;
  
  Reset(this);
  if (in_target != (Element *)0x0) {
    this->target = in_target;
    if (((this->smoothscroll_prefer_instant & 1U) == 0) || (scroll_behavior == Smooth)) {
      this->mode = Smoothscroll;
      UpdateTime(this);
      IncrementSmoothscrollTarget(this,delta_distance);
      bVar1 = HasSmoothscrollReachedTarget(this);
      if (bVar1) {
        Reset(this);
      }
    }
    else {
      PerformScrollOnTarget(this,delta_distance);
      this->target = (Element *)0x0;
    }
  }
  return;
}

Assistant:

void ScrollController::ActivateSmoothscroll(Element* in_target, Vector2f delta_distance, ScrollBehavior scroll_behavior)
{
	Reset();
	if (!in_target)
		return;

	target = in_target;

	// Do instant scroll if preferred.
	if (smoothscroll_prefer_instant && scroll_behavior != ScrollBehavior::Smooth)
	{
		PerformScrollOnTarget(delta_distance);
		target = nullptr;
		return;
	}

	mode = Mode::Smoothscroll;
	UpdateTime();
	IncrementSmoothscrollTarget(delta_distance);

	// If the target is scrolled to its edge already, simply cancel the smoothscroll operation.
	if (HasSmoothscrollReachedTarget())
		Reset();
}